

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifft.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ostream *poVar6;
  long lVar7;
  istream *input_stream_00;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_9;
  ostringstream error_message_8;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> imag;
  vector<double,_std::allocator<double>_> real;
  ostringstream error_message_6;
  InverseFastFourierTransform inverse_fast_fourier_transform;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_1;
  int tmp;
  int max;
  int min;
  ostringstream error_message;
  int option_char;
  OutputFormats output_format;
  InputFormats input_format;
  int fft_length;
  option *in_stack_ffffffffffffeae8;
  InverseFastFourierTransform *in_stack_ffffffffffffeaf0;
  InverseFastFourierTransform *in_stack_ffffffffffffeaf8;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffeb00;
  int in_stack_ffffffffffffeb04;
  size_type in_stack_ffffffffffffeb08;
  undefined7 in_stack_ffffffffffffeb10;
  undefined1 in_stack_ffffffffffffeb17;
  undefined5 in_stack_ffffffffffffeb20;
  undefined1 in_stack_ffffffffffffeb26;
  undefined1 in_stack_ffffffffffffeb27;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  undefined1 *puVar9;
  undefined7 in_stack_ffffffffffffeb50;
  char *local_14a8;
  char *local_1460;
  byte local_1412;
  byte local_13ca;
  allocator local_1381;
  string local_1380 [32];
  ostringstream local_1360 [56];
  ostringstream *in_stack_ffffffffffffecd8;
  string *in_stack_ffffffffffffece0;
  allocator local_11e1;
  string local_11e0 [32];
  ostringstream local_11c0 [383];
  allocator local_1041;
  string local_1040 [32];
  ostringstream local_1020 [383];
  vector<double,_std::allocator<double>_> local_ea1;
  undefined1 local_e81 [32];
  allocator local_e61;
  string local_e60 [32];
  ostringstream local_e40 [432];
  char *local_c90;
  undefined4 local_c88;
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  char local_ae8 [527];
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  char *local_740;
  allocator local_731;
  string local_730 [32];
  ostringstream local_710 [376];
  int local_598;
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [32];
  int local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [32];
  int local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 0;
  local_1c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long(in_stack_ffffffffffffeb04,(char **)in_stack_ffffffffffffeaf8,
                                   (char *)in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8,
                                   (int *)0x103755), pcVar1 = ya_optarg, local_20 != -1) {
    switch(local_20) {
    case 0x68:
      anon_unknown.dwarf_1734::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffeb17,in_stack_ffffffffffffeb10));
      return 0;
    default:
      anon_unknown.dwarf_1734::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffeb17,in_stack_ffffffffffffeb10));
      return 1;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffeaf8,(int *)in_stack_ffffffffffffeaf0);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"ifft",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case 0x6f:
      local_3c8 = 0;
      local_3cc = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffeaf8,(int *)in_stack_ffffffffffffeaf0);
      local_1412 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d0,0,2);
        local_1412 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if ((local_1412 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        poVar6 = std::operator<<((ostream *)local_570,
                                 "The argument for the -o option must be an integer ");
        poVar6 = std::operator<<(poVar6,"in the range of ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
        poVar6 = std::operator<<(poVar6," to ");
        std::ostream::operator<<(poVar6,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"ifft",&local_591);
        sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      local_1c = local_3d0;
      break;
    case 0x71:
      local_1f8 = 0;
      local_1fc = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffeaf8,(int *)in_stack_ffffffffffffeaf0);
      local_13ca = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_200,0,2);
        local_13ca = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_13ca & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar6 = std::operator<<((ostream *)local_3a0,
                                 "The argument for the -q option must be an integer ");
        poVar6 = std::operator<<(poVar6,"in the range of ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
        poVar6 = std::operator<<(poVar6," to ");
        std::ostream::operator<<(poVar6,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"ifft",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      local_18 = local_200;
    }
  }
  local_598 = local_8 - ya_optind;
  if (1 < local_598) {
    std::__cxx11::ostringstream::ostringstream(local_710);
    std::operator<<((ostream *)local_710,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"ifft",&local_731);
    sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_710);
    return local_4;
  }
  if (local_598 == 0) {
    local_1460 = (char *)0x0;
  }
  else {
    local_1460 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_740 = local_1460;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"ifft",&local_8d9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b8);
    return local_4;
  }
  std::ifstream::ifstream(local_ae8);
  pcVar1 = local_740;
  if (local_740 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ae8,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c60);
      poVar6 = std::operator<<((ostream *)local_c60,"Cannot open file ");
      std::operator<<(poVar6,local_740);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c80,"ifft",&local_c81);
      sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      std::__cxx11::string::~string(local_c80);
      std::allocator<char>::~allocator((allocator<char> *)&local_c81);
      local_4 = 1;
      local_c88 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c60);
      goto LAB_00104c08;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_14a8 = (char *)&std::cin;
  }
  else {
    local_14a8 = local_ae8;
  }
  local_c90 = local_14a8;
  sptk::InverseFastFourierTransform::InverseFastFourierTransform
            (in_stack_ffffffffffffeaf0,(int)((ulong)in_stack_ffffffffffffeae8 >> 0x20));
  uVar4 = sptk::InverseFastFourierTransform::IsValid((InverseFastFourierTransform *)0x104497);
  if ((bool)uVar4) {
    lVar7 = (long)local_14;
    puVar9 = local_e81;
    std::allocator<double>::allocator((allocator<double> *)0x1045fa);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffeb17,in_stack_ffffffffffffeb10),
               in_stack_ffffffffffffeb08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00));
    std::allocator<double>::~allocator((allocator<double> *)0x104620);
    input_stream_00 = (istream *)(long)local_14;
    sequence_to_read = &local_ea1;
    std::allocator<double>::allocator((allocator<double> *)0x10463f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffeb17,in_stack_ffffffffffffeb10),
               in_stack_ffffffffffffeb08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00));
    std::allocator<double>::~allocator((allocator<double> *)0x104665);
    do {
      do {
        if ((local_18 == 0) || (local_18 == 1)) {
          in_stack_ffffffffffffeae8 = (option *)0x0;
          in_stack_ffffffffffffeb27 =
               sptk::ReadStream<double>
                         (SUB81((ulong)puVar9 >> 0x30,0),(int)puVar9,(int)((ulong)lVar7 >> 0x20),
                          (int)lVar7,sequence_to_read,input_stream_00,
                          (int *)CONCAT17(uVar4,in_stack_ffffffffffffeb50));
          if ((bool)in_stack_ffffffffffffeb27) goto LAB_00104728;
LAB_00104b9c:
          local_4 = 0;
          local_c88 = 1;
          goto LAB_00104bb2;
        }
LAB_00104728:
        if ((local_18 == 0) || (local_18 == 2)) {
          in_stack_ffffffffffffeae8 = (option *)0x0;
          in_stack_ffffffffffffeb26 =
               sptk::ReadStream<double>
                         (SUB81((ulong)puVar9 >> 0x30,0),(int)puVar9,(int)((ulong)lVar7 >> 0x20),
                          (int)lVar7,sequence_to_read,input_stream_00,
                          (int *)CONCAT17(uVar4,in_stack_ffffffffffffeb50));
          if (!(bool)in_stack_ffffffffffffeb26) goto LAB_00104b9c;
        }
        uVar5 = sptk::InverseFastFourierTransform::Run
                          (in_stack_ffffffffffffeaf8,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaf0,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeae8);
        if (!(bool)uVar5) {
          std::__cxx11::ostringstream::ostringstream(local_1020);
          std::operator<<((ostream *)local_1020,"Failed to run inverse fast Fourier transform");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1040,"ifft",&local_1041);
          sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
          std::__cxx11::string::~string(local_1040);
          std::allocator<char>::~allocator((allocator<char> *)&local_1041);
          local_4 = 1;
          local_c88 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1020);
          goto LAB_00104bb2;
        }
        if (((local_1c == 0) || (local_1c == 1)) &&
           (bVar2 = sptk::WriteStream<double>
                              ((int)puVar9,(int)((ulong)lVar7 >> 0x20),sequence_to_read,
                               (ostream *)input_stream_00,
                               (int *)CONCAT17(in_stack_ffffffffffffeb27,
                                               CONCAT16(in_stack_ffffffffffffeb26,
                                                        CONCAT15(uVar5,in_stack_ffffffffffffeb20))))
           , !bVar2)) {
          std::__cxx11::ostringstream::ostringstream(local_11c0);
          std::operator<<((ostream *)local_11c0,"Failed to write real parts");
          paVar8 = &local_11e1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_11e0,"ifft",paVar8);
          sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
          std::__cxx11::string::~string(local_11e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
          local_4 = 1;
          local_c88 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_11c0);
          goto LAB_00104bb2;
        }
      } while ((local_1c != 0) && (local_1c != 2));
      bVar2 = sptk::WriteStream<double>
                        ((int)puVar9,(int)((ulong)lVar7 >> 0x20),sequence_to_read,
                         (ostream *)input_stream_00,
                         (int *)CONCAT17(in_stack_ffffffffffffeb27,
                                         CONCAT16(in_stack_ffffffffffffeb26,
                                                  CONCAT15(uVar5,in_stack_ffffffffffffeb20))));
      in_stack_ffffffffffffeb04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffeb04);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_1360);
    std::operator<<((ostream *)local_1360,"Failed to write imaginary parts");
    paVar8 = &local_1381;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1380,"ifft",paVar8);
    sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
    std::__cxx11::string::~string(local_1380);
    std::allocator<char>::~allocator((allocator<char> *)&local_1381);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1360);
LAB_00104bb2:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e40);
    std::operator<<((ostream *)local_e40,"FFT length must be a power of 2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e60,"ifft",&local_e61);
    sptk::PrintErrorMessage(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
    std::__cxx11::string::~string(local_e60);
    std::allocator<char>::~allocator((allocator<char> *)&local_e61);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e40);
  }
  sptk::InverseFastFourierTransform::~InverseFastFourierTransform
            ((InverseFastFourierTransform *)0x104bf7);
LAB_00104c08:
  std::ifstream::~ifstream(local_ae8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InverseFastFourierTransform inverse_fast_fourier_transform(fft_length);
  if (!inverse_fast_fourier_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "FFT length must be a power of 2";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::vector<double> real(fft_length);
  std::vector<double> imag(fft_length);

  for (;;) {
    if ((kInputRealAndImagParts == input_format ||
         kInputRealPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &real, &input_stream,
                          NULL)) {
      break;
    }
    if ((kInputRealAndImagParts == input_format ||
         kInputImagPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &imag, &input_stream,
                          NULL)) {
      break;
    }

    if (!inverse_fast_fourier_transform.Run(&real, &imag)) {
      std::ostringstream error_message;
      error_message << "Failed to run inverse fast Fourier transform";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format) &&
        !sptk::WriteStream(0, fft_length, real, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write real parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, fft_length, imag, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }

  return 0;
}